

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

void sqlite3VXPrintf(StrAccum *pAccum,int useExtended,char *fmt,__va_list_tag *ap)

{
  double dVar1;
  byte bVar2;
  bool bVar3;
  double dVar4;
  bool bVar5;
  bool bVar6;
  bool bVar7;
  bool bVar8;
  uint uVar9;
  double dVar10;
  int iVar11;
  undefined8 *puVar12;
  char *pcVar13;
  ulong *puVar14;
  byte *pbVar15;
  uint uVar16;
  byte bVar17;
  int iVar18;
  uint uVar19;
  uint *puVar20;
  double *pdVar21;
  long *plVar22;
  long lVar23;
  int iVar24;
  long lVar25;
  byte *pbVar26;
  char *pcVar27;
  int *piVar28;
  int iVar29;
  uint uVar30;
  uint uVar31;
  int iVar32;
  et_info *peVar33;
  uint uVar34;
  uint uVar35;
  etByte eVar36;
  uint uVar37;
  ulong uVar38;
  ulong unaff_R13;
  byte *pbVar39;
  ulong uVar40;
  ulong uVar41;
  byte *pbVar42;
  bool bVar43;
  bool bVar44;
  double dVar45;
  double y;
  char buf [70];
  byte *local_110;
  char local_108;
  byte *local_d8;
  ulong local_c8;
  byte local_78;
  undefined1 local_77 [71];
  
  local_110 = (byte *)0x0;
  do {
    pbVar26 = (byte *)fmt;
    if (*fmt != 0x25) {
      if (*fmt == 0) {
        return;
      }
      for (lVar25 = 1; (bVar17 = ((byte *)fmt)[lVar25], bVar17 != 0 && (bVar17 != 0x25));
          lVar25 = lVar25 + 1) {
      }
      sqlite3StrAccumAppend(pAccum,fmt,(int)lVar25);
      if (bVar17 == 0) {
        return;
      }
      pbVar26 = (byte *)fmt + lVar25;
      local_110 = (byte *)fmt;
    }
    bVar17 = pbVar26[1];
    if (bVar17 == 0) {
      sqlite3StrAccumAppend(pAccum,"%",1);
switchD_0011b8d7_default:
      return;
    }
    pbVar26 = pbVar26 + 1;
    bVar7 = false;
    iVar11 = 0;
    bVar6 = false;
    bVar5 = false;
    bVar43 = false;
    bVar8 = false;
    do {
      if (bVar17 < 0x2b) {
        if (bVar17 == 0x20) {
          bVar44 = true;
          bVar5 = true;
        }
        else if (bVar17 == 0x21) {
          bVar44 = true;
          iVar11 = 1;
        }
        else if (bVar17 == 0x23) {
          bVar44 = true;
          bVar6 = true;
        }
        else {
LAB_0011b713:
          bVar44 = false;
        }
      }
      else if (bVar17 == 0x30) {
        bVar44 = true;
        bVar7 = true;
      }
      else if (bVar17 == 0x2d) {
        bVar44 = true;
        bVar8 = true;
      }
      else {
        if (bVar17 != 0x2b) goto LAB_0011b713;
        bVar44 = true;
        bVar43 = true;
      }
      if (!bVar44) {
        iVar18 = (int)(char)bVar17;
        goto LAB_0011b741;
      }
      bVar17 = pbVar26[1];
      pbVar26 = pbVar26 + 1;
    } while (bVar17 != 0);
    iVar18 = 0;
LAB_0011b741:
    if (iVar18 == 0x2a) {
      uVar37 = ap->gp_offset;
      if ((ulong)uVar37 < 0x29) {
        puVar20 = (uint *)((ulong)uVar37 + (long)ap->reg_save_area);
        ap->gp_offset = uVar37 + 8;
      }
      else {
        puVar20 = (uint *)ap->overflow_arg_area;
        ap->overflow_arg_area = puVar20 + 2;
      }
      uVar37 = *puVar20;
      if ((int)uVar37 < 0) {
        bVar8 = true;
      }
      uVar35 = -uVar37;
      if (0 < (int)uVar37) {
        uVar35 = uVar37;
      }
      uVar38 = (ulong)uVar35;
      iVar18 = (int)(char)pbVar26[1];
      pbVar26 = pbVar26 + 1;
    }
    else {
      uVar38 = 0;
      if (iVar18 - 0x30U < 10) {
        uVar38 = 0;
        do {
          uVar38 = (ulong)((iVar18 + (int)uVar38 * 10) - 0x30);
          iVar18 = (int)(char)pbVar26[1];
          pbVar26 = pbVar26 + 1;
        } while (iVar18 - 0x30U < 10);
      }
    }
    uVar37 = (uint)uVar38;
    uVar40 = 0xffffffff;
    if (iVar18 == 0x2e) {
      pbVar15 = pbVar26 + 1;
      iVar18 = (int)(char)*pbVar15;
      if (iVar18 == 0x2a) {
        uVar35 = ap->gp_offset;
        if ((ulong)uVar35 < 0x29) {
          puVar20 = (uint *)((ulong)uVar35 + (long)ap->reg_save_area);
          ap->gp_offset = uVar35 + 8;
        }
        else {
          puVar20 = (uint *)ap->overflow_arg_area;
          ap->overflow_arg_area = puVar20 + 2;
        }
        uVar35 = *puVar20;
        uVar30 = -uVar35;
        if (0 < (int)uVar35) {
          uVar30 = uVar35;
        }
        uVar40 = (ulong)uVar30;
        iVar18 = (int)(char)pbVar26[2];
        pbVar26 = pbVar26 + 2;
      }
      else {
        pbVar26 = pbVar26 + 1;
        uVar40 = 0;
        if ((byte)(*pbVar15 - 0x30) < 10) {
          uVar40 = 0;
          do {
            uVar40 = (ulong)((iVar18 + (int)uVar40 * 10) - 0x30);
            pbVar15 = pbVar26 + 1;
            iVar18 = (int)(char)*pbVar15;
            pbVar26 = pbVar26 + 1;
          } while ((byte)(*pbVar15 - 0x30) < 10);
        }
      }
    }
    iVar32 = (int)uVar40;
    if (iVar18 == 0x6c) {
      iVar18 = (int)(char)pbVar26[1];
      if (iVar18 == 0x6c) {
        iVar18 = (int)(char)pbVar26[2];
        pbVar26 = pbVar26 + 2;
        bVar44 = true;
        bVar3 = true;
      }
      else {
        pbVar26 = pbVar26 + 1;
        bVar3 = true;
        bVar44 = false;
      }
    }
    else {
      bVar44 = false;
      bVar3 = false;
    }
    lVar25 = 0;
    do {
      if (iVar18 == (&fmtinfo[0].fmttype)[lVar25]) {
        if ((useExtended == 0) && (((&fmtinfo[0].flags)[lVar25] & 2) != 0)) {
          return;
        }
        peVar33 = (et_info *)(&fmtinfo[0].fmttype + lVar25);
        eVar36 = (&fmtinfo[0].type)[lVar25];
        goto LAB_0011b8ba;
      }
      lVar25 = lVar25 + 6;
    } while (lVar25 != 0x8a);
    peVar33 = fmtinfo;
    eVar36 = '\0';
LAB_0011b8ba:
    switch(eVar36) {
    case '\x01':
    case '\x10':
      goto switchD_0011b8d7_caseD_1;
    case '\x02':
    case '\x03':
    case '\x04':
      uVar35 = ap->fp_offset;
      if ((ulong)uVar35 < 0xa1) {
        pdVar21 = (double *)((ulong)uVar35 + (long)ap->reg_save_area);
        ap->fp_offset = uVar35 + 0x10;
      }
      else {
        pdVar21 = (double *)ap->overflow_arg_area;
        ap->overflow_arg_area = pdVar21 + 1;
      }
      dVar1 = *pdVar21;
      if (iVar32 < 0) {
        iVar32 = 6;
      }
      if (0.0 <= dVar1) {
        if (bVar43) {
          bVar17 = 0x2b;
          local_c8 = 1;
          bVar5 = false;
          pcVar13 = "+Inf";
        }
        else {
          bVar5 = !bVar5;
          local_c8 = (ulong)!bVar5;
          bVar17 = !bVar5 << 5;
          pcVar13 = "Inf";
        }
      }
      else {
        dVar1 = -dVar1;
        bVar17 = 0x2d;
        local_c8 = 1;
        bVar5 = false;
        pcVar13 = "-Inf";
      }
      uVar35 = (uint)(0 < iVar32 && eVar36 == '\x04');
      iVar18 = iVar32 - uVar35;
      dVar45 = 0.5;
      if (0 < iVar18) {
        iVar32 = (iVar32 - uVar35) + 1;
        dVar45 = 0.5;
        do {
          dVar45 = dVar45 * 0.1;
          iVar32 = iVar32 + -1;
        } while (1 < iVar32);
      }
      if (eVar36 == '\x02') {
        dVar1 = dVar1 + dVar45;
      }
      if (!NAN(dVar1)) {
        uVar40 = 0;
        if (0.0 < dVar1) {
          uVar19 = 0xffffff9c;
          uVar35 = 0xffffffc0;
          uVar30 = 0xfffffff8;
          uVar9 = 0xffffffff;
          dVar4 = 1.0;
          do {
            uVar34 = uVar9;
            uVar31 = uVar30;
            uVar16 = uVar35;
            dVar10 = dVar4;
            if (dVar1 < dVar4 * 1e+100) break;
            uVar19 = uVar19 + 100;
            uVar35 = uVar16 + 100;
            uVar30 = uVar31 + 100;
            uVar9 = uVar34 + 100;
            dVar4 = dVar4 * 1e+100;
          } while (uVar19 < 0x15f);
          do {
            dVar4 = dVar10;
            uVar30 = uVar34;
            uVar35 = uVar31;
            if (dVar1 < dVar4 * 1e+64) break;
            uVar16 = uVar16 + 0x40;
            uVar31 = uVar35 + 0x40;
            uVar34 = uVar30 + 0x40;
            dVar10 = dVar4 * 1e+64;
          } while (uVar16 < 0x15f);
          do {
            uVar40 = (ulong)uVar30;
            dVar10 = dVar4;
            if (dVar1 < dVar4 * 100000000.0) break;
            uVar35 = uVar35 + 8;
            uVar30 = uVar30 + 8;
            dVar4 = dVar4 * 100000000.0;
          } while (uVar35 < 0x15f);
          do {
            dVar4 = dVar10;
            uVar35 = (int)uVar40 + 1;
            uVar40 = (ulong)uVar35;
            dVar10 = dVar4 * 10.0;
            if (dVar1 < dVar10) break;
          } while (uVar35 < 0x15f);
          for (dVar1 = dVar1 / dVar4; dVar1 < 1e-08; dVar1 = dVar1 * 100000000.0) {
            uVar40 = (ulong)((int)uVar40 - 8);
          }
          for (; iVar32 = (int)uVar40, dVar1 < 1.0; dVar1 = dVar1 * 10.0) {
            uVar40 = (ulong)(iVar32 - 1);
          }
          if (0x15e < iVar32) {
            lVar25 = 0;
            do {
              pbVar15 = (byte *)pcVar13 + lVar25;
              lVar25 = lVar25 + 1;
            } while (*pbVar15 != 0);
            unaff_R13 = (ulong)((int)lVar25 - 1U & 0x3fffffff);
            local_110 = (byte *)pcVar13;
          }
          if (0x15e < iVar32) {
            local_d8 = (byte *)0x0;
            goto LAB_0011c670;
          }
        }
        if ((eVar36 != '\x02') && (dVar1 = dVar1 + dVar45, 10.0 <= dVar1)) {
          dVar1 = dVar1 * 0.1;
          uVar40 = (ulong)((int)uVar40 + 1);
        }
        iVar32 = (int)uVar40;
        local_108 = (char)iVar11;
        if (eVar36 == '\x04') {
          bVar44 = !bVar6;
          bVar43 = iVar18 < iVar32 || iVar32 < -4;
          iVar24 = iVar32;
          if (iVar18 < iVar32 || iVar32 < -4) {
            iVar24 = 0;
          }
          iVar18 = iVar18 - iVar24;
        }
        else {
          bVar43 = eVar36 == '\x03';
          bVar44 = local_108 != '\0';
        }
        iVar24 = iVar32;
        if (bVar43) {
          iVar24 = 0;
        }
        iVar29 = uVar37 + iVar18 + iVar24;
        if (iVar29 < 0x38) {
          local_d8 = (byte *)0x0;
          local_110 = &local_78;
        }
        else {
          local_110 = (byte *)sqlite3Malloc(iVar29 + 0xf);
          local_d8 = local_110;
          if (local_110 == (byte *)0x0) goto LAB_0011c704;
        }
        pbVar15 = local_110;
        if (!bVar5) {
          pbVar15 = local_110 + 1;
          *local_110 = bVar17;
        }
        iVar11 = iVar11 * 10 + 0x10;
        if (iVar24 < 0) {
          *pbVar15 = 0x30;
          pbVar15 = pbVar15 + 1;
          uVar35 = iVar24 + 1;
        }
        else {
          iVar24 = iVar24 + 1;
          do {
            if (iVar11 < 1) {
              bVar17 = 0x30;
            }
            else {
              dVar45 = ROUND(dVar1);
              iVar11 = iVar11 + -1;
              dVar1 = (dVar1 - (double)(int)dVar45) * 10.0;
              bVar17 = (char)(int)dVar45 + 0x30;
            }
            *pbVar15 = bVar17;
            pbVar15 = pbVar15 + 1;
            iVar24 = iVar24 + -1;
          } while (0 < iVar24);
          uVar35 = 0;
        }
        if ((bVar6 || local_108 != '\0') || 0 < iVar18) {
          *pbVar15 = 0x2e;
          pbVar15 = pbVar15 + 1;
        }
        iVar24 = iVar18;
        if ((int)uVar35 < 0) {
          memset(pbVar15,0x30,(ulong)-uVar35);
          pbVar15 = pbVar15 + (ulong)~uVar35 + 1;
          iVar24 = iVar18 + uVar35;
        }
        if (0 < iVar24) {
          iVar24 = ((int)uVar35 >> 0x1f & uVar35) + iVar18 + 1;
          do {
            if (iVar11 < 1) {
              bVar17 = 0x30;
            }
            else {
              dVar45 = ROUND(dVar1);
              iVar11 = iVar11 + -1;
              dVar1 = (dVar1 - (double)(int)dVar45) * 10.0;
              bVar17 = (char)(int)dVar45 + 0x30;
            }
            *pbVar15 = bVar17;
            pbVar15 = pbVar15 + 1;
            iVar24 = iVar24 + -1;
          } while (1 < iVar24);
        }
        if ((bool)(bVar44 & ((bVar6 || local_108 != '\0') || 0 < iVar18))) {
          while( true ) {
            pbVar42 = pbVar15 + -1;
            if (*pbVar42 != 0x30) break;
            *pbVar42 = 0;
            pbVar15 = pbVar42;
          }
          if (*pbVar42 == 0x2e) {
            if (local_108 == '\0') {
              *pbVar42 = 0;
              pbVar15 = pbVar42;
            }
            else {
              *pbVar15 = 0x30;
              pbVar15 = pbVar15 + 1;
            }
          }
        }
        if (bVar43) {
          *pbVar15 = "0123456789ABCDEF0123456789abcdef"[peVar33->charset];
          if (iVar32 < 0) {
            pbVar15[1] = 0x2d;
            uVar40 = (ulong)(uint)-iVar32;
          }
          else {
            pbVar15[1] = 0x2b;
          }
          if ((int)uVar40 < 100) {
            pbVar15 = pbVar15 + 2;
          }
          else {
            pbVar15[2] = (char)(uVar40 / 100) + 0x30;
            pbVar15 = pbVar15 + 3;
            uVar40 = (ulong)(uint)((int)uVar40 + (int)(uVar40 / 100) * -100);
          }
          *pbVar15 = (char)(uVar40 / 10) + 0x30;
          pbVar15[1] = (char)uVar40 + (char)(uVar40 / 10) * -10 | 0x30;
          pbVar15 = pbVar15 + 2;
        }
        *pbVar15 = 0;
        uVar35 = (uint)pbVar15 - (int)local_110;
        unaff_R13 = (ulong)uVar35;
        if (((bVar7) && (!bVar8)) && (uVar37 - uVar35 != 0 && (int)uVar35 <= (int)uVar37)) {
          if (-1 < (int)uVar35) {
            lVar25 = (long)(int)uVar37 + 1;
            lVar23 = (long)(int)uVar35;
            do {
              local_110[lVar25 + -1] = local_110[lVar23];
              lVar25 = lVar25 + -1;
              lVar23 = lVar23 + -1;
            } while ((int)(uVar37 - uVar35) < lVar25);
          }
          unaff_R13 = uVar38;
          if (uVar37 != uVar35) {
            memset(local_110 + local_c8,0x30,(ulong)(~(uint)pbVar15 + uVar37 + (int)local_110) + 1);
          }
        }
        goto LAB_0011c670;
      }
      uVar40 = 3;
      local_110 = (byte *)0x17d7af;
      goto LAB_0011c25e;
    case '\x05':
      iVar11 = pAccum->nChar;
      uVar37 = ap->gp_offset;
      if ((ulong)uVar37 < 0x29) {
        puVar12 = (undefined8 *)((ulong)uVar37 + (long)ap->reg_save_area);
        ap->gp_offset = uVar37 + 8;
      }
      else {
        puVar12 = (undefined8 *)ap->overflow_arg_area;
        ap->overflow_arg_area = puVar12 + 1;
      }
      *(int *)*puVar12 = iVar11;
      break;
    case '\x06':
    case '\a':
      uVar35 = ap->gp_offset;
      if ((ulong)uVar35 < 0x29) {
        puVar12 = (undefined8 *)((ulong)uVar35 + (long)ap->reg_save_area);
        ap->gp_offset = uVar35 + 8;
      }
      else {
        puVar12 = (undefined8 *)ap->overflow_arg_area;
        ap->overflow_arg_area = puVar12 + 1;
      }
      pbVar15 = (byte *)*puVar12;
      local_d8 = (byte *)0x0;
      if (eVar36 == '\a') {
        local_d8 = pbVar15;
      }
      local_110 = pbVar15;
      if (pbVar15 == (byte *)0x0) {
        local_110 = (byte *)0x1790dd;
        local_d8 = pbVar15;
      }
      if (iVar32 < 0) {
        lVar25 = 0;
        do {
          pbVar15 = local_110 + lVar25;
          lVar25 = lVar25 + 1;
        } while (*pbVar15 != 0);
        unaff_R13 = (ulong)((int)lVar25 - 1U & 0x3fffffff);
        goto LAB_0011c670;
      }
      if (iVar32 != 0) {
        uVar38 = 0;
        do {
          unaff_R13 = uVar38;
          if (local_110[uVar38] == 0) break;
          uVar38 = uVar38 + 1;
          unaff_R13 = uVar40;
        } while (uVar40 != uVar38);
        goto LAB_0011c670;
      }
      goto LAB_0011c2a4;
    case '\b':
      local_78 = 0x25;
LAB_0011c24e:
      uVar40 = 1;
      goto LAB_0011c256;
    case '\t':
      uVar35 = ap->gp_offset;
      if ((ulong)uVar35 < 0x29) {
        pbVar15 = (byte *)((ulong)uVar35 + (long)ap->reg_save_area);
        ap->gp_offset = uVar35 + 8;
      }
      else {
        pbVar15 = (byte *)ap->overflow_arg_area;
        ap->overflow_arg_area = pbVar15 + 8;
      }
      local_78 = *pbVar15;
      if (iVar32 < 0) goto LAB_0011c24e;
      if (1 < iVar32) {
        memset(local_77,(uint)local_78,(ulong)(iVar32 - 1));
      }
LAB_0011c256:
      local_110 = &local_78;
LAB_0011c25e:
      local_d8 = (byte *)0x0;
      unaff_R13 = uVar40;
      goto LAB_0011c670;
    case '\n':
    case '\v':
    case '\x0f':
      uVar35 = ap->gp_offset;
      if ((ulong)uVar35 < 0x29) {
        plVar22 = (long *)((ulong)uVar35 + (long)ap->reg_save_area);
        ap->gp_offset = uVar35 + 8;
      }
      else {
        plVar22 = (long *)ap->overflow_arg_area;
        ap->overflow_arg_area = plVar22 + 1;
      }
      bVar17 = (eVar36 != '\x0f') * '\x05' + 0x22;
      pcVar13 = (char *)*plVar22;
      pcVar27 = "(NULL)";
      if (eVar36 == '\v') {
        pcVar27 = "NULL";
      }
      if (pcVar13 != (char *)0x0) {
        pcVar27 = pcVar13;
      }
      if (iVar32 == 0) {
        iVar11 = 0;
        uVar38 = 0;
      }
      else {
        uVar41 = 0;
        iVar11 = 0;
        do {
          uVar38 = uVar41;
          if (pcVar27[uVar41] == 0) break;
          iVar11 = iVar11 + (uint)(pcVar27[uVar41] == bVar17);
          uVar41 = uVar41 + 1;
          uVar38 = uVar40;
        } while (iVar32 != (int)uVar41);
      }
      bVar43 = pcVar13 != (char *)0x0 && eVar36 == '\v';
      uVar35 = iVar11 + (int)uVar38 + (uint)bVar43 * 2 + 1;
      if (uVar35 < 0x47) {
        local_d8 = (byte *)0x0;
        local_110 = &local_78;
LAB_0011ba86:
        if (bVar43) {
          *local_110 = bVar17;
        }
        uVar35 = (uint)bVar43;
        if ((int)uVar38 == 0) {
          unaff_R13 = (ulong)uVar35;
        }
        else {
          uVar40 = 0;
          do {
            bVar2 = pcVar27[uVar40];
            local_110[(int)uVar35] = bVar2;
            unaff_R13 = (long)(int)uVar35 + 1;
            if (bVar2 == bVar17) {
              local_110[unaff_R13] = bVar2;
              unaff_R13 = (ulong)(uVar35 + 2);
            }
            uVar40 = uVar40 + 1;
            uVar35 = (uint)unaff_R13;
          } while ((uVar38 & 0xffffffff) != uVar40);
        }
        if (bVar43) {
          iVar11 = (int)unaff_R13;
          unaff_R13 = (ulong)(iVar11 + 1);
          local_110[iVar11] = bVar17;
        }
        local_110[(int)unaff_R13] = 0;
        bVar43 = true;
      }
      else {
        local_110 = (byte *)sqlite3Malloc(uVar35);
        local_d8 = local_110;
        if (local_110 != (byte *)0x0) goto LAB_0011ba86;
        pAccum->mallocFailed = '\x01';
        local_d8 = (byte *)0x0;
        bVar43 = false;
        local_110 = (byte *)0x0;
      }
      if (!bVar43) {
        return;
      }
      goto LAB_0011c670;
    case '\f':
      uVar37 = ap->gp_offset;
      if ((ulong)uVar37 < 0x29) {
        plVar22 = (long *)((ulong)uVar37 + (long)ap->reg_save_area);
        ap->gp_offset = uVar37 + 8;
      }
      else {
        plVar22 = (long *)ap->overflow_arg_area;
        ap->overflow_arg_area = plVar22 + 1;
      }
      puVar12 = (undefined8 *)*plVar22;
      if (puVar12 != (undefined8 *)0x0) {
        pcVar13 = (char *)*puVar12;
        iVar11 = *(int *)(puVar12 + 1);
        goto LAB_0011c287;
      }
      break;
    case '\r':
      uVar37 = ap->gp_offset;
      if ((ulong)uVar37 < 0x29) {
        plVar22 = (long *)((ulong)uVar37 + (long)ap->reg_save_area);
        ap->gp_offset = uVar37 + 8;
      }
      else {
        plVar22 = (long *)ap->overflow_arg_area;
        ap->overflow_arg_area = plVar22 + 1;
      }
      lVar25 = *plVar22;
      uVar37 = ap->gp_offset;
      if ((ulong)uVar37 < 0x29) {
        piVar28 = (int *)((ulong)uVar37 + (long)ap->reg_save_area);
        ap->gp_offset = uVar37 + 8;
      }
      else {
        piVar28 = (int *)ap->overflow_arg_area;
        ap->overflow_arg_area = piVar28 + 2;
      }
      iVar11 = *piVar28;
      pcVar13 = *(char **)(lVar25 + 0x10 + (long)iVar11 * 0x68);
      if (pcVar13 != (char *)0x0) {
        sqlite3StrAccumAppend(pAccum,pcVar13,-1);
        sqlite3StrAccumAppend(pAccum,".",1);
      }
      pcVar13 = *(char **)(lVar25 + (long)iVar11 * 0x68 + 0x18);
      iVar11 = -1;
LAB_0011c287:
      sqlite3StrAccumAppend(pAccum,pcVar13,iVar11);
      break;
    case '\x0e':
      bVar44 = true;
      bVar3 = true;
      goto switchD_0011b8d7_caseD_1;
    default:
      goto switchD_0011b8d7_default;
    }
    local_d8 = (byte *)0x0;
    uVar37 = 0;
LAB_0011c2a4:
    unaff_R13 = 0;
LAB_0011c670:
    iVar11 = (int)unaff_R13;
    if ((!bVar8) && (uVar37 - iVar11 != 0 && iVar11 <= (int)uVar37)) {
      sqlite3AppendSpace(pAccum,uVar37 - iVar11);
    }
    if (0 < iVar11) {
      sqlite3StrAccumAppend(pAccum,(char *)local_110,iVar11);
    }
    if ((bVar8) && (uVar37 - iVar11 != 0 && iVar11 <= (int)uVar37)) {
      sqlite3AppendSpace(pAccum,uVar37 - iVar11);
    }
    sqlite3_free(local_d8);
    fmt = (char *)(pbVar26 + 1);
  } while( true );
switchD_0011b8d7_caseD_1:
  if ((peVar33->flags & 1) == 0) {
    if (bVar44) {
      uVar35 = ap->gp_offset;
      if ((ulong)uVar35 < 0x29) {
        puVar14 = (ulong *)((ulong)uVar35 + (long)ap->reg_save_area);
        ap->gp_offset = uVar35 + 8;
      }
      else {
        puVar14 = (ulong *)ap->overflow_arg_area;
        ap->overflow_arg_area = puVar14 + 1;
      }
      uVar38 = *puVar14;
    }
    else {
      uVar35 = ap->gp_offset;
      if (bVar3) {
        if (uVar35 < 0x29) {
          puVar14 = (ulong *)((long)ap->reg_save_area + (ulong)uVar35);
          ap->gp_offset = uVar35 + 8;
        }
        else {
          puVar14 = (ulong *)ap->overflow_arg_area;
          ap->overflow_arg_area = puVar14 + 1;
        }
        uVar38 = *puVar14;
      }
      else {
        if (uVar35 < 0x29) {
          puVar20 = (uint *)((ulong)uVar35 + (long)ap->reg_save_area);
          ap->gp_offset = uVar35 + 8;
        }
        else {
          puVar20 = (uint *)ap->overflow_arg_area;
          ap->overflow_arg_area = puVar20 + 2;
        }
        uVar38 = (ulong)*puVar20;
      }
    }
    bVar17 = 0;
  }
  else {
    if (bVar44) {
      uVar35 = ap->gp_offset;
      if ((ulong)uVar35 < 0x29) {
        puVar14 = (ulong *)((ulong)uVar35 + (long)ap->reg_save_area);
        ap->gp_offset = uVar35 + 8;
      }
      else {
        puVar14 = (ulong *)ap->overflow_arg_area;
        ap->overflow_arg_area = puVar14 + 1;
      }
      uVar38 = *puVar14;
    }
    else {
      uVar35 = ap->gp_offset;
      if (bVar3) {
        if (uVar35 < 0x29) {
          puVar14 = (ulong *)((long)ap->reg_save_area + (ulong)uVar35);
          ap->gp_offset = uVar35 + 8;
        }
        else {
          puVar14 = (ulong *)ap->overflow_arg_area;
          ap->overflow_arg_area = puVar14 + 1;
        }
        uVar38 = *puVar14;
      }
      else {
        if (uVar35 < 0x29) {
          piVar28 = (int *)((ulong)uVar35 + (long)ap->reg_save_area);
          ap->gp_offset = uVar35 + 8;
        }
        else {
          piVar28 = (int *)ap->overflow_arg_area;
          ap->overflow_arg_area = piVar28 + 2;
        }
        uVar38 = (ulong)*piVar28;
      }
    }
    if ((long)uVar38 < 0) {
      uVar38 = -uVar38;
      bVar17 = 0x2d;
    }
    else {
      bVar17 = 0x2b;
      if (!bVar43) {
        bVar17 = bVar5 << 5;
      }
    }
  }
  iVar11 = iVar32;
  if ((bVar7) && (iVar11 = (uVar37 - 1) + (uint)(bVar17 == 0), iVar11 < iVar32)) {
    iVar11 = iVar32;
  }
  if (iVar11 < 0x3c) {
    iVar18 = 0x46;
    local_d8 = (byte *)0x0;
    pbVar15 = &local_78;
  }
  else {
    iVar18 = iVar11 + 10;
    local_d8 = (byte *)sqlite3Malloc(iVar18);
    pbVar15 = local_d8;
    if (local_d8 == (byte *)0x0) {
LAB_0011c704:
      pAccum->mallocFailed = '\x01';
      return;
    }
  }
  pbVar39 = pbVar15 + (iVar18 - 1);
  pbVar42 = pbVar39;
  if (eVar36 == '\x10') {
    uVar40 = uVar38 % 10;
    if ((uVar38 / 10) % 10 == 1) {
      uVar40 = 0;
    }
    if (3 < uVar38 % 10) {
      uVar40 = 0;
    }
    pbVar42 = pbVar39 + -2;
    *(undefined2 *)(pbVar39 + -2) = *(undefined2 *)("thstndrd" + uVar40 * 2);
  }
  bVar2 = peVar33->charset;
  iVar18 = 0x3c;
  if (0x3c < iVar11) {
    iVar18 = iVar11;
  }
  uVar41 = (ulong)peVar33->base;
  iVar11 = (int)pbVar42 + iVar11;
  iVar32 = (iVar11 - iVar18) - (int)pbVar15;
  uVar35 = iVar32 - 10;
  lVar25 = 0;
  uVar40 = uVar38;
  do {
    pbVar42[lVar25 + -1] = "0123456789ABCDEF0123456789abcdef"[uVar40 % uVar41 + (ulong)bVar2];
    lVar25 = lVar25 + -1;
    uVar35 = uVar35 - 1;
    bVar43 = uVar41 <= uVar40;
    uVar40 = uVar40 / uVar41;
  } while (bVar43);
  if (((iVar11 - iVar18) - (int)pbVar15) + (int)lVar25 + -9 < 1) {
    local_110 = pbVar42 + lVar25;
  }
  else {
    local_110 = pbVar42 + (lVar25 - (ulong)uVar35) + -1;
    memset(local_110,0x30,(ulong)((iVar32 + (int)lVar25) - 10) + 1);
  }
  if (bVar17 != 0) {
    local_110[-1] = bVar17;
    local_110 = local_110 + -1;
  }
  if (bVar6 && uVar38 != 0) {
    bVar17 = peVar33->prefix;
    if ((6 < bVar17) || ((0x49U >> (bVar17 & 0x1f) & 1) == 0)) {
      pbVar15 = (byte *)("-x0" + bVar17);
      bVar17 = *pbVar15;
      do {
        pbVar15 = pbVar15 + 1;
        local_110[-1] = bVar17;
        local_110 = local_110 + -1;
        bVar17 = *pbVar15;
      } while (bVar17 != 0);
    }
  }
  unaff_R13 = (ulong)(uint)((int)pbVar39 - (int)local_110);
  goto LAB_0011c670;
}

Assistant:

SQLITE_PRIVATE void sqlite3VXPrintf(
  StrAccum *pAccum,                  /* Accumulate results here */
  int useExtended,                   /* Allow extended %-conversions */
  const char *fmt,                   /* Format string */
  va_list ap                         /* arguments */
){
  int c;                     /* Next character in the format string */
  char *bufpt;               /* Pointer to the conversion buffer */
  int precision;             /* Precision of the current field */
  int length;                /* Length of the field */
  int idx;                   /* A general purpose loop counter */
  int width;                 /* Width of the current field */
  etByte flag_leftjustify;   /* True if "-" flag is present */
  etByte flag_plussign;      /* True if "+" flag is present */
  etByte flag_blanksign;     /* True if " " flag is present */
  etByte flag_alternateform; /* True if "#" flag is present */
  etByte flag_altform2;      /* True if "!" flag is present */
  etByte flag_zeropad;       /* True if field width constant starts with zero */
  etByte flag_long;          /* True if "l" flag is present */
  etByte flag_longlong;      /* True if the "ll" flag is present */
  etByte done;               /* Loop termination flag */
  etByte xtype = 0;          /* Conversion paradigm */
  char prefix;               /* Prefix character.  "+" or "-" or " " or '\0'. */
  sqlite_uint64 longvalue;   /* Value for integer types */
  LONGDOUBLE_TYPE realvalue; /* Value for real types */
  const et_info *infop;      /* Pointer to the appropriate info structure */
  char *zOut;                /* Rendering buffer */
  int nOut;                  /* Size of the rendering buffer */
  char *zExtra;              /* Malloced memory used by some conversion */
#ifndef SQLITE_OMIT_FLOATING_POINT
  int  exp, e2;              /* exponent of real numbers */
  int nsd;                   /* Number of significant digits returned */
  double rounder;            /* Used for rounding floating point values */
  etByte flag_dp;            /* True if decimal point should be shown */
  etByte flag_rtz;           /* True if trailing zeros should be removed */
#endif
  char buf[etBUFSIZE];       /* Conversion buffer */

  bufpt = 0;
  for(; (c=(*fmt))!=0; ++fmt){
    if( c!='%' ){
      int amt;
      bufpt = (char *)fmt;
      amt = 1;
      while( (c=(*++fmt))!='%' && c!=0 ) amt++;
      sqlite3StrAccumAppend(pAccum, bufpt, amt);
      if( c==0 ) break;
    }
    if( (c=(*++fmt))==0 ){
      sqlite3StrAccumAppend(pAccum, "%", 1);
      break;
    }
    /* Find out what flags are present */
    flag_leftjustify = flag_plussign = flag_blanksign = 
     flag_alternateform = flag_altform2 = flag_zeropad = 0;
    done = 0;
    do{
      switch( c ){
        case '-':   flag_leftjustify = 1;     break;
        case '+':   flag_plussign = 1;        break;
        case ' ':   flag_blanksign = 1;       break;
        case '#':   flag_alternateform = 1;   break;
        case '!':   flag_altform2 = 1;        break;
        case '0':   flag_zeropad = 1;         break;
        default:    done = 1;                 break;
      }
    }while( !done && (c=(*++fmt))!=0 );
    /* Get the field width */
    width = 0;
    if( c=='*' ){
      width = va_arg(ap,int);
      if( width<0 ){
        flag_leftjustify = 1;
        width = -width;
      }
      c = *++fmt;
    }else{
      while( c>='0' && c<='9' ){
        width = width*10 + c - '0';
        c = *++fmt;
      }
    }
    /* Get the precision */
    if( c=='.' ){
      precision = 0;
      c = *++fmt;
      if( c=='*' ){
        precision = va_arg(ap,int);
        if( precision<0 ) precision = -precision;
        c = *++fmt;
      }else{
        while( c>='0' && c<='9' ){
          precision = precision*10 + c - '0';
          c = *++fmt;
        }
      }
    }else{
      precision = -1;
    }
    /* Get the conversion type modifier */
    if( c=='l' ){
      flag_long = 1;
      c = *++fmt;
      if( c=='l' ){
        flag_longlong = 1;
        c = *++fmt;
      }else{
        flag_longlong = 0;
      }
    }else{
      flag_long = flag_longlong = 0;
    }
    /* Fetch the info entry for the field */
    infop = &fmtinfo[0];
    xtype = etINVALID;
    for(idx=0; idx<ArraySize(fmtinfo); idx++){
      if( c==fmtinfo[idx].fmttype ){
        infop = &fmtinfo[idx];
        if( useExtended || (infop->flags & FLAG_INTERN)==0 ){
          xtype = infop->type;
        }else{
          return;
        }
        break;
      }
    }
    zExtra = 0;

    /*
    ** At this point, variables are initialized as follows:
    **
    **   flag_alternateform          TRUE if a '#' is present.
    **   flag_altform2               TRUE if a '!' is present.
    **   flag_plussign               TRUE if a '+' is present.
    **   flag_leftjustify            TRUE if a '-' is present or if the
    **                               field width was negative.
    **   flag_zeropad                TRUE if the width began with 0.
    **   flag_long                   TRUE if the letter 'l' (ell) prefixed
    **                               the conversion character.
    **   flag_longlong               TRUE if the letter 'll' (ell ell) prefixed
    **                               the conversion character.
    **   flag_blanksign              TRUE if a ' ' is present.
    **   width                       The specified field width.  This is
    **                               always non-negative.  Zero is the default.
    **   precision                   The specified precision.  The default
    **                               is -1.
    **   xtype                       The class of the conversion.
    **   infop                       Pointer to the appropriate info struct.
    */
    switch( xtype ){
      case etPOINTER:
        flag_longlong = sizeof(char*)==sizeof(i64);
        flag_long = sizeof(char*)==sizeof(long int);
        /* Fall through into the next case */
      case etORDINAL:
      case etRADIX:
        if( infop->flags & FLAG_SIGNED ){
          i64 v;
          if( flag_longlong ){
            v = va_arg(ap,i64);
          }else if( flag_long ){
            v = va_arg(ap,long int);
          }else{
            v = va_arg(ap,int);
          }
          if( v<0 ){
            if( v==SMALLEST_INT64 ){
              longvalue = ((u64)1)<<63;
            }else{
              longvalue = -v;
            }
            prefix = '-';
          }else{
            longvalue = v;
            if( flag_plussign )        prefix = '+';
            else if( flag_blanksign )  prefix = ' ';
            else                       prefix = 0;
          }
        }else{
          if( flag_longlong ){
            longvalue = va_arg(ap,u64);
          }else if( flag_long ){
            longvalue = va_arg(ap,unsigned long int);
          }else{
            longvalue = va_arg(ap,unsigned int);
          }
          prefix = 0;
        }
        if( longvalue==0 ) flag_alternateform = 0;
        if( flag_zeropad && precision<width-(prefix!=0) ){
          precision = width-(prefix!=0);
        }
        if( precision<etBUFSIZE-10 ){
          nOut = etBUFSIZE;
          zOut = buf;
        }else{
          nOut = precision + 10;
          zOut = zExtra = sqlite3Malloc( nOut );
          if( zOut==0 ){
            pAccum->mallocFailed = 1;
            return;
          }
        }
        bufpt = &zOut[nOut-1];
        if( xtype==etORDINAL ){
          static const char zOrd[] = "thstndrd";
          int x = (int)(longvalue % 10);
          if( x>=4 || (longvalue/10)%10==1 ){
            x = 0;
          }
          *(--bufpt) = zOrd[x*2+1];
          *(--bufpt) = zOrd[x*2];
        }
        {
          register const char *cset;      /* Use registers for speed */
          register int base;
          cset = &aDigits[infop->charset];
          base = infop->base;
          do{                                           /* Convert to ascii */
            *(--bufpt) = cset[longvalue%base];
            longvalue = longvalue/base;
          }while( longvalue>0 );
        }
        length = (int)(&zOut[nOut-1]-bufpt);
        for(idx=precision-length; idx>0; idx--){
          *(--bufpt) = '0';                             /* Zero pad */
        }
        if( prefix ) *(--bufpt) = prefix;               /* Add sign */
        if( flag_alternateform && infop->prefix ){      /* Add "0" or "0x" */
          const char *pre;
          char x;
          pre = &aPrefix[infop->prefix];
          for(; (x=(*pre))!=0; pre++) *(--bufpt) = x;
        }
        length = (int)(&zOut[nOut-1]-bufpt);
        break;
      case etFLOAT:
      case etEXP:
      case etGENERIC:
        realvalue = va_arg(ap,double);
#ifdef SQLITE_OMIT_FLOATING_POINT
        length = 0;
#else
        if( precision<0 ) precision = 6;         /* Set default precision */
        if( realvalue<0.0 ){
          realvalue = -realvalue;
          prefix = '-';
        }else{
          if( flag_plussign )          prefix = '+';
          else if( flag_blanksign )    prefix = ' ';
          else                         prefix = 0;
        }
        if( xtype==etGENERIC && precision>0 ) precision--;
#if 0
        /* Rounding works like BSD when the constant 0.4999 is used.  Wierd! */
        for(idx=precision, rounder=0.4999; idx>0; idx--, rounder*=0.1);
#else
        /* It makes more sense to use 0.5 */
        for(idx=precision, rounder=0.5; idx>0; idx--, rounder*=0.1){}
#endif
        if( xtype==etFLOAT ) realvalue += rounder;
        /* Normalize realvalue to within 10.0 > realvalue >= 1.0 */
        exp = 0;
        if( sqlite3IsNaN((double)realvalue) ){
          bufpt = "NaN";
          length = 3;
          break;
        }
        if( realvalue>0.0 ){
          LONGDOUBLE_TYPE scale = 1.0;
          while( realvalue>=1e100*scale && exp<=350 ){ scale *= 1e100;exp+=100;}
          while( realvalue>=1e64*scale && exp<=350 ){ scale *= 1e64; exp+=64; }
          while( realvalue>=1e8*scale && exp<=350 ){ scale *= 1e8; exp+=8; }
          while( realvalue>=10.0*scale && exp<=350 ){ scale *= 10.0; exp++; }
          realvalue /= scale;
          while( realvalue<1e-8 ){ realvalue *= 1e8; exp-=8; }
          while( realvalue<1.0 ){ realvalue *= 10.0; exp--; }
          if( exp>350 ){
            if( prefix=='-' ){
              bufpt = "-Inf";
            }else if( prefix=='+' ){
              bufpt = "+Inf";
            }else{
              bufpt = "Inf";
            }
            length = sqlite3Strlen30(bufpt);
            break;
          }
        }
        bufpt = buf;
        /*
        ** If the field type is etGENERIC, then convert to either etEXP
        ** or etFLOAT, as appropriate.
        */
        if( xtype!=etFLOAT ){
          realvalue += rounder;
          if( realvalue>=10.0 ){ realvalue *= 0.1; exp++; }
        }
        if( xtype==etGENERIC ){
          flag_rtz = !flag_alternateform;
          if( exp<-4 || exp>precision ){
            xtype = etEXP;
          }else{
            precision = precision - exp;
            xtype = etFLOAT;
          }
        }else{
          flag_rtz = flag_altform2;
        }
        if( xtype==etEXP ){
          e2 = 0;
        }else{
          e2 = exp;
        }
        if( e2+precision+width > etBUFSIZE - 15 ){
          bufpt = zExtra = sqlite3Malloc( e2+precision+width+15 );
          if( bufpt==0 ){
            pAccum->mallocFailed = 1;
            return;
          }
        }
        zOut = bufpt;
        nsd = 16 + flag_altform2*10;
        flag_dp = (precision>0 ?1:0) | flag_alternateform | flag_altform2;
        /* The sign in front of the number */
        if( prefix ){
          *(bufpt++) = prefix;
        }
        /* Digits prior to the decimal point */
        if( e2<0 ){
          *(bufpt++) = '0';
        }else{
          for(; e2>=0; e2--){
            *(bufpt++) = et_getdigit(&realvalue,&nsd);
          }
        }
        /* The decimal point */
        if( flag_dp ){
          *(bufpt++) = '.';
        }
        /* "0" digits after the decimal point but before the first
        ** significant digit of the number */
        for(e2++; e2<0; precision--, e2++){
          assert( precision>0 );
          *(bufpt++) = '0';
        }
        /* Significant digits after the decimal point */
        while( (precision--)>0 ){
          *(bufpt++) = et_getdigit(&realvalue,&nsd);
        }
        /* Remove trailing zeros and the "." if no digits follow the "." */
        if( flag_rtz && flag_dp ){
          while( bufpt[-1]=='0' ) *(--bufpt) = 0;
          assert( bufpt>zOut );
          if( bufpt[-1]=='.' ){
            if( flag_altform2 ){
              *(bufpt++) = '0';
            }else{
              *(--bufpt) = 0;
            }
          }
        }
        /* Add the "eNNN" suffix */
        if( xtype==etEXP ){
          *(bufpt++) = aDigits[infop->charset];
          if( exp<0 ){
            *(bufpt++) = '-'; exp = -exp;
          }else{
            *(bufpt++) = '+';
          }
          if( exp>=100 ){
            *(bufpt++) = (char)((exp/100)+'0');        /* 100's digit */
            exp %= 100;
          }
          *(bufpt++) = (char)(exp/10+'0');             /* 10's digit */
          *(bufpt++) = (char)(exp%10+'0');             /* 1's digit */
        }
        *bufpt = 0;

        /* The converted number is in buf[] and zero terminated. Output it.
        ** Note that the number is in the usual order, not reversed as with
        ** integer conversions. */
        length = (int)(bufpt-zOut);
        bufpt = zOut;

        /* Special case:  Add leading zeros if the flag_zeropad flag is
        ** set and we are not left justified */
        if( flag_zeropad && !flag_leftjustify && length < width){
          int i;
          int nPad = width - length;
          for(i=width; i>=nPad; i--){
            bufpt[i] = bufpt[i-nPad];
          }
          i = prefix!=0;
          while( nPad-- ) bufpt[i++] = '0';
          length = width;
        }
#endif /* !defined(SQLITE_OMIT_FLOATING_POINT) */
        break;
      case etSIZE:
        *(va_arg(ap,int*)) = pAccum->nChar;
        length = width = 0;
        break;
      case etPERCENT:
        buf[0] = '%';
        bufpt = buf;
        length = 1;
        break;
      case etCHARX:
        c = va_arg(ap,int);
        buf[0] = (char)c;
        if( precision>=0 ){
          for(idx=1; idx<precision; idx++) buf[idx] = (char)c;
          length = precision;
        }else{
          length =1;
        }
        bufpt = buf;
        break;
      case etSTRING:
      case etDYNSTRING:
        bufpt = va_arg(ap,char*);
        if( bufpt==0 ){
          bufpt = "";
        }else if( xtype==etDYNSTRING ){
          zExtra = bufpt;
        }
        if( precision>=0 ){
          for(length=0; length<precision && bufpt[length]; length++){}
        }else{
          length = sqlite3Strlen30(bufpt);
        }
        break;
      case etSQLESCAPE:
      case etSQLESCAPE2:
      case etSQLESCAPE3: {
        int i, j, k, n, isnull;
        int needQuote;
        char ch;
        char q = ((xtype==etSQLESCAPE3)?'"':'\'');   /* Quote character */
        char *escarg = va_arg(ap,char*);
        isnull = escarg==0;
        if( isnull ) escarg = (xtype==etSQLESCAPE2 ? "NULL" : "(NULL)");
        k = precision;
        for(i=n=0; k!=0 && (ch=escarg[i])!=0; i++, k--){
          if( ch==q )  n++;
        }
        needQuote = !isnull && xtype==etSQLESCAPE2;
        n += i + 1 + needQuote*2;
        if( n>etBUFSIZE ){
          bufpt = zExtra = sqlite3Malloc( n );
          if( bufpt==0 ){
            pAccum->mallocFailed = 1;
            return;
          }
        }else{
          bufpt = buf;
        }
        j = 0;
        if( needQuote ) bufpt[j++] = q;
        k = i;
        for(i=0; i<k; i++){
          bufpt[j++] = ch = escarg[i];
          if( ch==q ) bufpt[j++] = ch;
        }
        if( needQuote ) bufpt[j++] = q;
        bufpt[j] = 0;
        length = j;
        /* The precision in %q and %Q means how many input characters to
        ** consume, not the length of the output...
        ** if( precision>=0 && precision<length ) length = precision; */
        break;
      }
      case etTOKEN: {
        Token *pToken = va_arg(ap, Token*);
        if( pToken ){
          sqlite3StrAccumAppend(pAccum, (const char*)pToken->z, pToken->n);
        }
        length = width = 0;
        break;
      }
      case etSRCLIST: {
        SrcList *pSrc = va_arg(ap, SrcList*);
        int k = va_arg(ap, int);
        struct SrcList_item *pItem = &pSrc->a[k];
        assert( k>=0 && k<pSrc->nSrc );
        if( pItem->zDatabase ){
          sqlite3StrAccumAppend(pAccum, pItem->zDatabase, -1);
          sqlite3StrAccumAppend(pAccum, ".", 1);
        }
        sqlite3StrAccumAppend(pAccum, pItem->zName, -1);
        length = width = 0;
        break;
      }
      default: {
        assert( xtype==etINVALID );
        return;
      }
    }/* End switch over the format type */
    /*
    ** The text of the conversion is pointed to by "bufpt" and is
    ** "length" characters long.  The field width is "width".  Do
    ** the output.
    */
    if( !flag_leftjustify ){
      register int nspace;
      nspace = width-length;
      if( nspace>0 ){
        sqlite3AppendSpace(pAccum, nspace);
      }
    }
    if( length>0 ){
      sqlite3StrAccumAppend(pAccum, bufpt, length);
    }
    if( flag_leftjustify ){
      register int nspace;
      nspace = width-length;
      if( nspace>0 ){
        sqlite3AppendSpace(pAccum, nspace);
      }
    }
    sqlite3_free(zExtra);
  }/* End for loop over the format string */
}